

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall
CLI::App::_parse(App *this,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  App *in_RDI;
  App *unaff_retaddr;
  bool in_stack_0000001e;
  bool in_stack_0000001f;
  App *in_stack_00000020;
  bool positional_only;
  bool in_stack_0000003e;
  bool in_stack_0000003f;
  App *in_stack_00000040;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000048;
  App *in_stack_00000050;
  bool *in_stack_00000060;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000068;
  App *in_stack_00000070;
  App *in_stack_000000a0;
  App *in_stack_00000500;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffd8;
  App *in_stack_ffffffffffffffe0;
  undefined1 recurse;
  App *this_00;
  
  this_00 = in_RDI;
  increment_parsed(in_stack_ffffffffffffffe0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::size(in_RSI);
  _trigger_pre_parse(unaff_retaddr,(size_t)this_00);
  do {
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffffe0);
    recurse = (undefined1)((ulong)in_RSI >> 0x38);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    bVar1 = _parse_single(in_stack_00000070,in_stack_00000068,in_stack_00000060);
    recurse = (undefined1)((ulong)in_RSI >> 0x38);
  } while (bVar1);
  if (in_RDI->parent_ == (App *)0x0) {
    _process(in_stack_ffffffffffffffe0);
    _process_extras(in_stack_00000050,in_stack_00000048);
    remaining_for_passthrough_abi_cxx11_(this_00,(bool)recurse);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffffe0);
  }
  else {
    bVar1 = ::std::function::operator_cast_to_bool((function<void_()> *)0x1dac41);
    if (bVar1) {
      _process_env(in_stack_000000a0);
      _process_callbacks(this);
      _process_help_flags(in_stack_00000020,in_stack_0000001f,in_stack_0000001e);
      _process_requirements(in_stack_00000500);
      run_callback(in_stack_00000040,in_stack_0000003f,in_stack_0000003e);
    }
  }
  return;
}

Assistant:

CLI11_INLINE void App::_parse(std::vector<std::string> &args) {
    increment_parsed();
    _trigger_pre_parse(args.size());
    bool positional_only = false;

    while(!args.empty()) {
        if(!_parse_single(args, positional_only)) {
            break;
        }
    }

    if(parent_ == nullptr) {
        _process();

        // Throw error if any items are left over (depending on settings)
        _process_extras(args);

        // Convert missing (pairs) to extras (string only) ready for processing in another app
        args = remaining_for_passthrough(false);
    } else if(parse_complete_callback_) {
        _process_env();
        _process_callbacks();
        _process_help_flags();
        _process_requirements();
        run_callback(false, true);
    }
}